

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool exists_unaccessed_path_to_return
               (CFG *cfg,uint32_t block,
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               *blocks)

{
  size_t sVar1;
  uint *puVar2;
  bool bVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  SmallVector<unsigned_int,_8UL> *pSVar6;
  long lVar7;
  bool bVar8;
  uint32_t local_34;
  uint32_t local_30;
  uint32_t local_2c;
  
  local_34 = block;
  cVar4 = std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&blocks->_M_h,&local_34);
  if (cVar4.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
    local_30 = local_34;
    cVar5 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(cfg->succeeding_edges)._M_h,&local_30);
    pSVar6 = (SmallVector<unsigned_int,_8UL> *)
             ((long)cVar5.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                    ._M_cur + 0x10);
    if (cVar5.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      pSVar6 = &cfg->empty_vector;
    }
    if ((pSVar6->super_VectorView<unsigned_int>).buffer_size == 0) {
      return true;
    }
    local_2c = local_34;
    cVar5 = std::
            _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(cfg->succeeding_edges)._M_h,&local_2c);
    pSVar6 = (SmallVector<unsigned_int,_8UL> *)
             ((long)cVar5.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
                    ._M_cur + 0x10);
    if (cVar5.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::SmallVector<unsigned_int,_8UL>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      pSVar6 = &cfg->empty_vector;
    }
    sVar1 = (pSVar6->super_VectorView<unsigned_int>).buffer_size;
    if (sVar1 != 0) {
      puVar2 = (pSVar6->super_VectorView<unsigned_int>).ptr;
      lVar7 = 0;
      do {
        bVar3 = exists_unaccessed_path_to_return(cfg,*(uint32_t *)((long)puVar2 + lVar7),blocks);
        if (bVar3) {
          return bVar3;
        }
        bVar8 = sVar1 * 4 + -4 != lVar7;
        lVar7 = lVar7 + 4;
      } while (bVar8);
      return bVar3;
    }
  }
  return false;
}

Assistant:

static bool exists_unaccessed_path_to_return(const CFG &cfg, uint32_t block, const unordered_set<uint32_t> &blocks)
{
	// This block accesses the variable.
	if (blocks.find(block) != end(blocks))
		return false;

	// We are at the end of the CFG.
	if (cfg.get_succeeding_edges(block).empty())
		return true;

	// If any of our successors have a path to the end, there exists a path from block.
	for (auto &succ : cfg.get_succeeding_edges(block))
		if (exists_unaccessed_path_to_return(cfg, succ, blocks))
			return true;

	return false;
}